

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ComputeUVMappingProcess.cpp
# Opt level: O2

void __thiscall
Assimp::ComputeUVMappingProcess::ComputePlaneMapping
          (ComputeUVMappingProcess *this,aiMesh *mesh,aiVector3D *axis,aiVector3D *out)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  long lVar3;
  uint pnt;
  ulong uVar4;
  float fVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  aiVector3t<float> aVar13;
  aiVector3D local_a8;
  aiVector3D local_98;
  aiVector3D local_88;
  undefined8 local_78;
  undefined8 uStack_70;
  aiMatrix4x4 mTrafo;
  
  local_88.x = 0.0;
  local_88.y = 0.0;
  local_88.z = 0.0;
  local_a8.x = 0.0;
  local_a8.y = 0.0;
  local_a8.z = 0.0;
  local_98.x = 0.0;
  local_98.y = 0.0;
  local_98.z = 0.0;
  fVar5 = operator*(axis,(aiVector3t<float> *)(anonymous_namespace)::base_axis_x);
  if (0.95 <= fVar5) {
    FindMeshCenter(mesh,&local_88,&local_a8,&local_98);
    auVar7._0_4_ = local_98.y - local_a8.y;
    auVar7._4_4_ = local_98.z - local_a8.z;
    auVar7._8_8_ = 0;
    lVar3 = 0;
    for (uVar4 = 0; uVar4 < mesh->mNumVertices; uVar4 = uVar4 + 1) {
      uVar1 = *(undefined8 *)((long)&mesh->mVertices->y + lVar3);
      auVar10._0_4_ = (float)uVar1 - local_a8.y;
      auVar10._4_4_ = (float)((ulong)uVar1 >> 0x20) - local_a8.z;
      auVar10._8_8_ = 0;
      auVar10 = divps(auVar10,auVar7);
      *(ulong *)((long)&out->x + lVar3) = CONCAT44(auVar10._0_4_,auVar10._4_4_);
      *(undefined4 *)((long)&out->z + lVar3) = 0;
      lVar3 = lVar3 + 0xc;
    }
  }
  else {
    fVar5 = operator*(axis,(aiVector3t<float> *)(anonymous_namespace)::base_axis_y);
    if (0.95 <= fVar5) {
      FindMeshCenter(mesh,&local_88,&local_a8,&local_98);
      auVar8._0_4_ = local_98.x - local_a8.x;
      auVar8._4_4_ = local_98.z - local_a8.z;
      auVar8._8_8_ = 0;
      lVar3 = 8;
      for (uVar4 = 0; uVar4 < mesh->mNumVertices; uVar4 = uVar4 + 1) {
        auVar11._0_4_ = *(float *)((long)mesh->mVertices + lVar3 + -8) - local_a8.x;
        auVar11._4_4_ = *(float *)((long)&mesh->mVertices->x + lVar3) - local_a8.z;
        auVar11._8_8_ = 0;
        auVar7 = divps(auVar11,auVar8);
        *(long *)((long)out + lVar3 + -8) = auVar7._0_8_;
        *(undefined4 *)((long)&out->x + lVar3) = 0;
        lVar3 = lVar3 + 0xc;
      }
    }
    else {
      fVar5 = operator*(axis,(aiVector3t<float> *)(anonymous_namespace)::base_axis_z);
      if (0.95 <= fVar5) {
        FindMeshCenter(mesh,&local_88,&local_a8,&local_98);
        auVar9._0_4_ = local_98.x - local_a8.x;
        auVar9._4_4_ = local_98.y - local_a8.y;
        auVar9._8_8_ = 0;
        lVar3 = 0;
        for (uVar4 = 0; uVar4 < mesh->mNumVertices; uVar4 = uVar4 + 1) {
          uVar1 = *(undefined8 *)((long)&mesh->mVertices->x + lVar3);
          auVar12._0_4_ = (float)uVar1 - local_a8.x;
          auVar12._4_4_ = (float)((ulong)uVar1 >> 0x20) - local_a8.y;
          auVar12._8_8_ = 0;
          auVar7 = divps(auVar12,auVar9);
          *(long *)((long)&out->x + lVar3) = auVar7._0_8_;
          *(undefined4 *)((long)&out->z + lVar3) = 0;
          lVar3 = lVar3 + 0xc;
        }
      }
      else {
        mTrafo.a1 = 1.0;
        mTrafo._4_12_ = ZEXT812(0);
        mTrafo.b1 = 0;
        mTrafo.b2 = 1.0;
        mTrafo.c3 = 1.0;
        mTrafo.d4 = 1.0;
        mTrafo._24_16_ = mTrafo._4_16_;
        mTrafo._44_16_ = mTrafo._4_16_;
        aiMatrix4x4t<float>::FromToMatrix
                  (axis,(aiVector3t<float> *)(anonymous_namespace)::base_axis_y,&mTrafo);
        FindMeshCenterTransformed(mesh,&local_88,&local_a8,&local_98,&mTrafo);
        local_78 = CONCAT44(local_98.z - local_a8.z,local_98.x - local_a8.x);
        uStack_70 = 0;
        lVar3 = 0;
        fVar5 = 0.0;
        for (uVar4 = 0; uVar4 < mesh->mNumVertices; uVar4 = uVar4 + 1) {
          aVar13 = operator*(&mTrafo,(aiVector3t<float> *)((long)&mesh->mVertices->x + lVar3));
          auVar6._0_4_ = aVar13.x - local_a8.x;
          auVar6._4_4_ = aVar13.z - local_a8.z;
          auVar6._8_4_ = aVar13.y - 0.0;
          auVar6._12_4_ = fVar5 - 0.0;
          auVar2._8_8_ = uStack_70;
          auVar2._0_8_ = local_78;
          auVar7 = divps(auVar6,auVar2);
          *(long *)((long)&out->x + lVar3) = auVar7._0_8_;
          *(undefined4 *)((long)&out->z + lVar3) = 0;
          lVar3 = lVar3 + 0xc;
          fVar5 = local_a8.z;
        }
      }
    }
  }
  return;
}

Assistant:

ComputeUVMappingProcess::~ComputeUVMappingProcess()
{
    // nothing to do here
}